

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall SQCompiler::CreateFunction(SQCompiler *this,SQObject *name,bool lambda)

{
  SQUnsignedInteger *pSVar1;
  SQLexer *this_00;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQTable *pSVar4;
  SQFuncState *pSVar5;
  SQFuncState *this_01;
  ulong uVar6;
  SQFuncState *this_02;
  SQInteger SVar7;
  long lVar8;
  SQObjectPtr *p;
  ulong uVar9;
  SQObjectType SVar10;
  undefined7 in_register_00000011;
  long lVar11;
  SQUnsignedInteger SVar12;
  SQObject SVar13;
  SQObject local_58;
  undefined4 local_44;
  SQObject local_40;
  
  local_44 = (undefined4)CONCAT71(in_register_00000011,lambda);
  this_02 = SQFuncState::PushChildState(this->_fs,this->_vm->_sharedstate);
  SVar10 = (this_02->_name).super_SQObject._type;
  pSVar3 = (this_02->_name).super_SQObject._unVal.pTable;
  pSVar4 = (name->_unVal).pTable;
  (this_02->_name).super_SQObject._unVal.pTable = pSVar4;
  SVar2 = name->_type;
  (this_02->_name).super_SQObject._type = SVar2;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar10 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  SVar13 = SQFuncState::CreateString(this->_fs,"this",-1);
  local_58._unVal = SVar13._unVal;
  local_58._type = SVar13._type;
  SQFuncState::AddParameter(this_02,&local_58);
  SVar10 = (this_02->_sourcename).super_SQObject._type;
  pSVar3 = (this_02->_sourcename).super_SQObject._unVal.pTable;
  pSVar4 = (this->_sourcename).super_SQObject._unVal.pTable;
  (this_02->_sourcename).super_SQObject._unVal.pTable = pSVar4;
  SVar2 = (this->_sourcename).super_SQObject._type;
  (this_02->_sourcename).super_SQObject._type = SVar2;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar10 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  this_00 = &this->_lex;
  lVar11 = 0;
  do {
    if (this->_token == 0x29) {
LAB_00112570:
      Expect(this,0x29);
      if (0 < lVar11) {
        do {
          SQFuncState::PopTarget(this->_fs);
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      pSVar5 = this->_fs;
      this->_fs = this_02;
      if ((char)local_44 == '\0') {
        Statement(this,false);
      }
      else {
        Expression(this);
        this_01 = this->_fs;
        SVar7 = SQFuncState::PopTarget(this_01);
        local_58._4_4_ = 0x117;
        local_58._type = (SQObjectType)SVar7;
        SQFuncState::AddInstruction(this_01,(SQInstruction *)&local_58);
      }
      SQFuncState::AddLineInfos
                (this_02,(&(this->_lex)._currentline)[(this->_lex)._prevtoken == 10],this->_lineinfo
                 ,true);
      local_58._type = 0;
      local_58._4_4_ = 0xff17;
      SQFuncState::AddInstruction(this_02,(SQInstruction *)&local_58);
      SQFuncState::SetStackSize(this_02,0);
      local_58._unVal.pFunctionProto = SQFuncState::BuildProto(this_02);
      this->_fs = pSVar5;
      local_58._type = OT_FUNCPROTO;
      pSVar1 = &((local_58._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted
                ._uiRef;
      *pSVar1 = *pSVar1 + 1;
      uVar6 = (pSVar5->_functions)._allocated;
      p = (pSVar5->_functions)._vals;
      uVar9 = (pSVar5->_functions)._size;
      SVar10 = OT_FUNCPROTO;
      if (uVar6 <= uVar9) {
        SVar12 = 4;
        if (uVar9 * 2 != 0) {
          SVar12 = uVar9 * 2;
        }
        p = (SQObjectPtr *)sq_vm_realloc(p,uVar6 << 4,SVar12 << 4);
        (pSVar5->_functions)._vals = p;
        (pSVar5->_functions)._allocated = SVar12;
        uVar9 = (pSVar5->_functions)._size;
        SVar10 = local_58._type;
      }
      (pSVar5->_functions)._size = uVar9 + 1;
      p[uVar9].super_SQObject._type = SVar10;
      p[uVar9].super_SQObject._unVal.pFunctionProto = (SQFunctionProto *)local_58._unVal;
      if ((SVar10 >> 0x1b & 1) != 0) {
        pSVar1 = &((local_58._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_58);
      SQFuncState::PopChildState(this->_fs);
      return;
    }
    if (this->_token == 0x138) {
      if (0 < lVar11) {
        Error(this,"function with default parameters cannot have variable number of parameters");
      }
      SVar13 = SQFuncState::CreateString(this->_fs,"vargv",-1);
      local_58._unVal = SVar13._unVal;
      local_58._type = SVar13._type;
      SQFuncState::AddParameter(this_02,&local_58);
      this_02->_varparams = true;
      SVar7 = SQLexer::Lex(this_00);
      this->_token = SVar7;
      if (SVar7 != 0x29) {
        Error(this,"expected \')\'");
      }
      goto LAB_00112570;
    }
    SVar13 = Expect(this,0x102);
    local_40._unVal = SVar13._unVal;
    local_40._type = SVar13._type;
    SQFuncState::AddParameter(this_02,&local_40);
    lVar8 = this->_token;
    if (lVar8 == 0x3d) {
      SVar7 = SQLexer::Lex(this_00);
      this->_token = SVar7;
      Expression(this);
      SVar7 = SQFuncState::TopTarget(this->_fs);
      SQFuncState::AddDefaultParam(this_02,SVar7);
      lVar11 = lVar11 + 1;
LAB_001124d6:
      lVar8 = this->_token;
    }
    else if (0 < lVar11) {
      Error(this,"expected \'=\'");
      goto LAB_001124d6;
    }
    if (lVar8 != 0x29) {
      if (lVar8 == 0x2c) {
        SVar7 = SQLexer::Lex(this_00);
        this->_token = SVar7;
      }
      else {
        Error(this,"expected \')\' or \',\'");
      }
    }
  } while( true );
}

Assistant:

void CreateFunction(SQObject &name,bool lambda = false)
    {
        SQFuncState *funcstate = _fs->PushChildState(_ss(_vm));
        funcstate->_name = name;
        SQObject paramname;
        funcstate->AddParameter(_fs->CreateString(_SC("this")));
        funcstate->_sourcename = _sourcename;
        SQInteger defparams = 0;
        while(_token!=_SC(')')) {
            if(_token == TK_VARPARAMS) {
                if(defparams > 0) Error(_SC("function with default parameters cannot have variable number of parameters"));
                funcstate->AddParameter(_fs->CreateString(_SC("vargv")));
                funcstate->_varparams = true;
                Lex();
                if(_token != _SC(')')) Error(_SC("expected ')'"));
                break;
            }
            else {
                paramname = Expect(TK_IDENTIFIER);
                funcstate->AddParameter(paramname);
                if(_token == _SC('=')) {
                    Lex();
                    Expression();
                    funcstate->AddDefaultParam(_fs->TopTarget());
                    defparams++;
                }
                else {
                    if(defparams > 0) Error(_SC("expected '='"));
                }
                if(_token == _SC(',')) Lex();
                else if(_token != _SC(')')) Error(_SC("expected ')' or ','"));
            }
        }
        Expect(_SC(')'));
        for(SQInteger n = 0; n < defparams; n++) {
            _fs->PopTarget();
        }

        SQFuncState *currchunk = _fs;
        _fs = funcstate;
        if(lambda) {
            Expression();
            _fs->AddInstruction(_OP_RETURN, 1, _fs->PopTarget());}
        else {
            Statement(false);
        }
        funcstate->AddLineInfos(_lex._prevtoken == _SC('\n')?_lex._lasttokenline:_lex._currentline, _lineinfo, true);
        funcstate->AddInstruction(_OP_RETURN, -1);
        funcstate->SetStackSize(0);

        SQFunctionProto *func = funcstate->BuildProto();
#ifdef _DEBUG_DUMP
        funcstate->Dump(func);
#endif
        _fs = currchunk;
        _fs->_functions.push_back(func);
        _fs->PopChildState();
    }